

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O2

char * str_replace(char *haystack,char *needle,char *replacement)

{
  _Bool _Var1;
  int iVar2;
  string_buffer_t *sb;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  int iVar6;
  ulong uVar7;
  
  if (haystack == (char *)0x0) {
    __assert_fail("haystack != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x280,"char *str_replace(const char *, const char *, const char *)");
  }
  if (needle == (char *)0x0) {
    __assert_fail("needle != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x281,"char *str_replace(const char *, const char *, const char *)");
  }
  if (replacement == (char *)0x0) {
    __assert_fail("replacement != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x282,"char *str_replace(const char *, const char *, const char *)");
  }
  sb = string_buffer_create();
  sVar3 = strlen(haystack);
  sVar4 = strlen(needle);
  iVar6 = 0;
  do {
    uVar7 = (ulong)iVar6;
    if (sVar3 <= uVar7) {
      if (sVar4 == 0 && sVar3 == 0) {
        string_buffer_append_string(sb,replacement);
      }
      pcVar5 = string_buffer_to_string(sb);
      string_buffer_destroy(sb);
      return pcVar5;
    }
    if (sVar4 == 0) {
LAB_003cf10f:
      string_buffer_append(sb,haystack[uVar7]);
      iVar2 = 1;
    }
    else {
      _Var1 = str_starts_with(haystack + uVar7,needle);
      if (!_Var1) goto LAB_003cf10f;
      string_buffer_append_string(sb,replacement);
      iVar2 = (int)sVar4;
    }
    iVar6 = iVar6 + iVar2;
  } while( true );
}

Assistant:

char *str_replace(const char *haystack, const char *needle, const char *replacement)
{
    assert(haystack != NULL);
    assert(needle != NULL);
    assert(replacement != NULL);

    string_buffer_t *sb = string_buffer_create();
    size_t haystack_len = strlen(haystack);
    size_t needle_len = strlen(needle);

    int pos = 0;
    while (pos < haystack_len) {
        if (needle_len > 0 && str_starts_with(&haystack[pos], needle)) {
            string_buffer_append_string(sb, replacement);
            pos += needle_len;
        } else {
            string_buffer_append(sb, haystack[pos]);
            pos++;
        }
    }
    if (needle_len == 0 && haystack_len == 0)
        string_buffer_append_string(sb, replacement);

    char *res = string_buffer_to_string(sb);
    string_buffer_destroy(sb);
    return res;
}